

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

Bounds2f __thiscall
pbrt::RealisticCamera::BoundExitPupil(RealisticCamera *this,Float filmX0,Float filmX1)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  ulong uVar4;
  int i;
  uint64_t a;
  int iVar5;
  Float FVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar11 [56];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [56];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Bounds2<float> BVar19;
  Bounds2f BVar20;
  Float filmX1_local;
  Float filmX0_local;
  Bounds2f projRearBounds;
  Bounds2<float> local_88;
  undefined1 local_78 [16];
  Ray local_60;
  Point2<float> local_38;
  undefined1 auVar10 [64];
  undefined1 extraout_var [60];
  undefined1 auVar14 [64];
  
  local_88.pMax.super_Tuple2<pbrt::Point2,_float>.x = -3.4028235e+38;
  local_88.pMax.super_Tuple2<pbrt::Point2,_float>.y = -3.4028235e+38;
  local_88.pMin.super_Tuple2<pbrt::Point2,_float>.x = 3.4028235e+38;
  local_88.pMin.super_Tuple2<pbrt::Point2,_float>.y = 3.4028235e+38;
  local_38.super_Tuple2<pbrt::Point2,_float>.x =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
  local_60.o.super_Tuple3<pbrt::Point3,_float>.x =
       local_38.super_Tuple2<pbrt::Point2,_float>.x * -1.5;
  local_38.super_Tuple2<pbrt::Point2,_float>.x = local_38.super_Tuple2<pbrt::Point2,_float>.x * 1.5;
  filmX1_local = filmX1;
  filmX0_local = filmX0;
  local_60.o.super_Tuple3<pbrt::Point3,_float>.y = local_60.o.super_Tuple3<pbrt::Point3,_float>.x;
  local_38.super_Tuple2<pbrt::Point2,_float>.y = local_38.super_Tuple2<pbrt::Point2,_float>.x;
  Bounds2<float>::Bounds2(&projRearBounds,(Point2<float> *)&local_60,&local_38);
  a = 0;
  iVar5 = 0;
  do {
    if (a == 0x100000) {
      if (iVar5 == 0) {
        if (LOGGING_LogLevel < 1) {
          Log<float&,float&>(Verbose,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
                             ,900,"Unable to find exit pupil in x = [%f,%f] on film.",&filmX0_local,
                             &filmX1_local);
        }
        BVar19.pMax.super_Tuple2<pbrt::Point2,_float> =
             projRearBounds.pMax.super_Tuple2<pbrt::Point2,_float>;
        BVar19.pMin.super_Tuple2<pbrt::Point2,_float> =
             projRearBounds.pMin.super_Tuple2<pbrt::Point2,_float>;
      }
      else {
        auVar7._8_8_ = 0;
        auVar7._0_4_ = projRearBounds.pMin.super_Tuple2<pbrt::Point2,_float>.x;
        auVar7._4_4_ = projRearBounds.pMin.super_Tuple2<pbrt::Point2,_float>.y;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = projRearBounds.pMax.super_Tuple2<pbrt::Point2,_float>.x;
        auVar13._4_4_ = projRearBounds.pMax.super_Tuple2<pbrt::Point2,_float>.y;
        auVar7 = vsubps_avx(auVar13,auVar7);
        auVar8._0_4_ = auVar7._0_4_ * auVar7._0_4_;
        auVar8._4_4_ = auVar7._4_4_ * auVar7._4_4_;
        auVar8._8_4_ = auVar7._8_4_ * auVar7._8_4_;
        auVar8._12_4_ = auVar7._12_4_ * auVar7._12_4_;
        auVar7 = vhaddps_avx(auVar8,auVar8);
        auVar7 = vsqrtss_avx(auVar7,auVar7);
        BVar19 = Expand<float,double>
                           (&local_88,(double)(auVar7._0_4_ + auVar7._0_4_) * 0.0009765625);
      }
      BVar20.pMin.super_Tuple2<pbrt::Point2,_float> = BVar19.pMin.super_Tuple2<pbrt::Point2,_float>;
      BVar20.pMax.super_Tuple2<pbrt::Point2,_float> = BVar19.pMax.super_Tuple2<pbrt::Point2,_float>;
      return BVar20;
    }
    fVar3 = ((float)(int)a + 0.5) * 9.536743e-07;
    local_78._0_4_ = RadicalInverse(0,a);
    local_78._4_4_ = extraout_XMM0_Db;
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._12_4_ = extraout_XMM0_Dd;
    auVar9._0_4_ = RadicalInverse(1,a);
    BVar19 = local_88;
    auVar9._4_60_ = extraout_var;
    auVar12._8_8_ = 0;
    auVar12._0_4_ = projRearBounds.pMin.super_Tuple2<pbrt::Point2,_float>.x;
    auVar12._4_4_ = projRearBounds.pMin.super_Tuple2<pbrt::Point2,_float>.y;
    auVar7 = vinsertps_avx(local_78,auVar9._0_16_,0x10);
    auVar17._8_4_ = 0x3f800000;
    auVar17._0_8_ = 0x3f8000003f800000;
    auVar17._12_4_ = 0x3f800000;
    auVar18._0_4_ = auVar7._0_4_ * projRearBounds.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    auVar18._4_4_ = auVar7._4_4_ * projRearBounds.pMax.super_Tuple2<pbrt::Point2,_float>.y;
    auVar18._8_4_ = auVar7._8_4_ * 0.0;
    auVar18._12_4_ = auVar7._12_4_ * 0.0;
    auVar16._8_8_ = 0;
    auVar16._0_4_ = local_88.pMin.super_Tuple2<pbrt::Point2,_float>.x;
    auVar16._4_4_ = local_88.pMin.super_Tuple2<pbrt::Point2,_float>.y;
    auVar7 = vsubps_avx(auVar17,auVar7);
    auVar11 = (undefined1  [56])0x0;
    auVar7 = vfmadd231ps_fma(auVar18,auVar12,auVar7);
    local_88.pMax.super_Tuple2<pbrt::Point2,_float>.x =
         BVar19.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    uVar4 = vcmpps_avx512vl(auVar16,auVar7,6);
    if ((((byte)uVar4 | (byte)(uVar4 >> 1) & 0x7f) & 1) != 0 ||
        local_88.pMax.super_Tuple2<pbrt::Point2,_float>.x < auVar7._0_4_) {
LAB_003c37fa:
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * filmX1)),ZEXT416((uint)(1.0 - fVar3)),
                               ZEXT416((uint)filmX0));
      local_60.o.super_Tuple3<pbrt::Point3,_float>.x = auVar8._0_4_;
      auVar8 = vblendps_avx(ZEXT416((uint)(auVar7._0_4_ -
                                          local_60.o.super_Tuple3<pbrt::Point3,_float>.x)),auVar7,2)
      ;
      auVar8 = vmovlhps_avx(ZEXT816(0) << 0x20,auVar8);
      auVar15 = ZEXT856(auVar8._8_8_);
      local_60.o.super_Tuple3<pbrt::Point3,_float>.y = auVar8._0_4_;
      local_60._8_12_ = auVar8._4_12_;
      local_60.time = 0.0;
      local_60.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      local_88 = BVar19;
      local_78 = auVar7;
      local_60.d.super_Tuple3<pbrt::Vector3,_float>.z =
           (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
      FVar6 = TraceLensesFromFilm(this,&local_60,(Ray *)0x0);
      auVar11 = extraout_var_00;
      auVar7 = local_78;
      if ((FVar6 != 0.0) || (NAN(FVar6))) goto LAB_003c386d;
    }
    else {
      local_88.pMax.super_Tuple2<pbrt::Point2,_float>.y =
           BVar19.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      auVar15 = (undefined1  [56])0x0;
      auVar8 = vmovshdup_avx(auVar7);
      bVar2 = local_88.pMax.super_Tuple2<pbrt::Point2,_float>.y < auVar8._0_4_;
      local_88 = BVar19;
      if (bVar2) goto LAB_003c37fa;
LAB_003c386d:
      uVar1 = vmovlps_avx(auVar7);
      local_60.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar1;
      local_60.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar1 >> 0x20);
      BVar19 = Union<float>(&local_88,(Point2<float> *)&local_60);
      auVar14._0_8_ = BVar19.pMax.super_Tuple2<pbrt::Point2,_float>;
      auVar14._8_56_ = auVar15;
      auVar10._0_8_ = BVar19.pMin.super_Tuple2<pbrt::Point2,_float>;
      auVar10._8_56_ = auVar11;
      local_88 = (Bounds2<float>)vmovlhps_avx(auVar10._0_16_,auVar14._0_16_);
      iVar5 = iVar5 + 1;
    }
    a = a + 1;
  } while( true );
}

Assistant:

Bounds2f RealisticCamera::BoundExitPupil(Float filmX0, Float filmX1) const {
    Bounds2f pupilBounds;
    // Sample a collection of points on the rear lens to find exit pupil
    const int nSamples = 1024 * 1024;
    int nExitingRays = 0;
    // Compute bounding box of projection of rear element on sampling plane
    Float rearRadius = RearElementRadius();
    Bounds2f projRearBounds(Point2f(-1.5f * rearRadius, -1.5f * rearRadius),
                            Point2f(1.5f * rearRadius, 1.5f * rearRadius));

    for (int i = 0; i < nSamples; ++i) {
        // Find location of sample points on $x$ segment and rear lens element
        Point3f pFilm(Lerp((i + 0.5f) / nSamples, filmX0, filmX1), 0, 0);
        Float u[2] = {RadicalInverse(0, i), RadicalInverse(1, i)};
        Point3f pRear(Lerp(u[0], projRearBounds.pMin.x, projRearBounds.pMax.x),
                      Lerp(u[1], projRearBounds.pMin.y, projRearBounds.pMax.y),
                      LensRearZ());

        // Expand pupil bounds if ray makes it through the lens system
        if (Inside(Point2f(pRear.x, pRear.y), pupilBounds) ||
            TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr)) {
            pupilBounds = Union(pupilBounds, Point2f(pRear.x, pRear.y));
            ++nExitingRays;
        }
    }

    // Return entire element bounds if no rays made it through the lens system
    if (nExitingRays == 0) {
        LOG_VERBOSE("Unable to find exit pupil in x = [%f,%f] on film.", filmX0, filmX1);
        return projRearBounds;
    }

    // Expand bounds to account for sample spacing
    pupilBounds =
        Expand(pupilBounds, 2 * Length(projRearBounds.Diagonal()) / std::sqrt(nSamples));

    return pupilBounds;
}